

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O0

void __thiscall
ParticleArrayTest_Size_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>_>::TestBody
          (ParticleArrayTest_Size_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>_>
           *this)

{
  bool bVar1;
  Type type;
  AssertHelper *this_00;
  int *in_RDI;
  AssertionResult gtest_ar;
  int i;
  int numParticles;
  ParticleArray particles;
  ConstParticleRef in_stack_ffffffffffffff38;
  ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  char *in_stack_ffffffffffffff60;
  AssertHelper *in_stack_ffffffffffffff70;
  Message *in_stack_ffffffffffffff98;
  AssertHelper *in_stack_ffffffffffffffa0;
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *in_stack_ffffffffffffffc0;
  int local_28;
  
  pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>::ParticleArrayAoS
            ((ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_> *)0x216049);
  for (local_28 = 0; local_28 < 0xc; local_28 = local_28 + 1) {
    BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
              (in_stack_ffffffffffffffc0);
    pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>::pushBack
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  type = pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>::size
                   ((ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_> *)0x2160c9);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_RDI,
             (int *)in_stack_ffffffffffffff40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff70);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff70);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x21611f)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff70,type,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
               (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x21616d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2161cd);
  pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>::~ParticleArrayAoS
            ((ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_> *)0x2161ec);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Size)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    int numParticles = 12;
    for (int i = 0; i < numParticles; i++)
        particles.pushBack(this->randomParticle());
    ASSERT_EQ(numParticles, particles.size());
}